

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O1

void anova_list(reg_object *list,int N)

{
  ulong uVar1;
  double dVar2;
  uint uVar3;
  ulong uVar4;
  
  putchar(10);
  puts("ANOVA Multiple Models : ");
  printf("%-10s%-25s%-20s%-20s%-20s \n","Model","Res.Df","RSS","Df","Sum of Sq");
  printf("%-10d%-25d%-20lf \n",(*list)->RSS,0,(ulong)(uint)(*list)->df_RSS);
  if (1 < N) {
    uVar4 = 1;
    do {
      uVar1 = uVar4 + 1;
      uVar3 = list[uVar4]->df_RSS;
      dVar2 = list[uVar4]->RSS;
      printf("%-10d%-25d%-20lf%-20d%-20lf \n",dVar2,list[uVar4 - 1]->RSS - dVar2,uVar1 & 0xffffffff,
             (ulong)uVar3,(ulong)(list[uVar4 - 1]->df_RSS - uVar3));
      uVar4 = uVar1;
    } while ((uint)N != uVar1);
  }
  return;
}

Assistant:

void anova_list(reg_object *list, int N) {
	int i;
	printf("\n");
	printf("ANOVA Multiple Models : \n");
	printf("%-10s%-25s%-20s%-20s%-20s \n","Model", "Res.Df", "RSS", "Df", "Sum of Sq");
	printf("%-10d%-25d%-20lf \n", 0,
		list[0]->df_RSS, list[0]->RSS);
	for(i = 1; i < N;++i) {
		printf("%-10d%-25d%-20lf%-20d%-20lf \n", i+1,
		list[i]->df_RSS, list[i]->RSS, list[i-1]->df_RSS-list[i]->df_RSS,list[i-1]->RSS-list[i]->RSS);
	}
}